

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5StorageInsertDocsize(Fts5Storage *p,i64 iRowid,Fts5Buffer *pBuf)

{
  sqlite3_stmt *pStmt;
  int iVar1;
  sqlite3_stmt *pReplace;
  
  if (p->pConfig->bColumnsize == 0) {
    iVar1 = 0;
  }
  else {
    pReplace = (sqlite3_stmt *)0x0;
    iVar1 = fts5StorageGetStmt(p,6,&pReplace,(char **)0x0);
    pStmt = pReplace;
    if (iVar1 == 0) {
      sqlite3_bind_int64(pReplace,1,iRowid);
      sqlite3_bind_blob(pStmt,2,pBuf->p,pBuf->n,(_func_void_void_ptr *)0x0);
      sqlite3_step(pStmt);
      iVar1 = sqlite3_reset(pStmt);
      sqlite3_bind_null(pStmt,2);
    }
  }
  return iVar1;
}

Assistant:

static int fts5StorageInsertDocsize(
  Fts5Storage *p,                 /* Storage module to write to */
  i64 iRowid,                     /* id value */
  Fts5Buffer *pBuf                /* sz value */
){
  int rc = SQLITE_OK;
  if( p->pConfig->bColumnsize ){
    sqlite3_stmt *pReplace = 0;
    rc = fts5StorageGetStmt(p, FTS5_STMT_REPLACE_DOCSIZE, &pReplace, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pReplace, 1, iRowid);
      sqlite3_bind_blob(pReplace, 2, pBuf->p, pBuf->n, SQLITE_STATIC);
      sqlite3_step(pReplace);
      rc = sqlite3_reset(pReplace);
      sqlite3_bind_null(pReplace, 2);
    }
  }
  return rc;
}